

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_float<char,fmt::v10::appender,float>
                   (appender out,float value,format_specs<char> specs,locale_ref loc)

{
  long lVar1;
  char cVar2;
  int iVar3;
  float_specs fVar4;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar5;
  appender it;
  int precision;
  appender out_00;
  float_specs *in_R9;
  bool bVar6;
  undefined4 in_XMM0_Db;
  ulong uVar7;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  format_specs<char> specs_00;
  float_specs fspecs;
  big_decimal_fp f;
  float_specs local_270;
  format_specs<char> local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  big_decimal_fp local_248;
  buffer<char> local_238;
  char local_218 [504];
  
  local_268._8_8_ = specs._8_8_;
  local_268._0_8_ = specs._0_8_;
  local_258 = CONCAT44(in_XMM0_Db,value);
  uStack_250 = CONCAT44(in_XMM0_Dd,in_XMM0_Dc);
  fVar4 = parse_float_type_spec<char>(&local_268);
  local_270._6_2_ = fVar4._6_2_;
  local_270._0_5_ = fVar4._0_5_;
  local_270._5_1_ = (char)((((ushort)local_268._9_2_ & 0x70) << 4) >> 8);
  if ((int)local_258 < 0) {
    local_270 = (float_specs)((ulong)fVar4 & 0xffff00ffffffffff | 0x10000000000);
    uVar7 = local_258 ^ 0x8000000080000000;
    uStack_250 = uStack_250 ^ 0x8000000080000000;
  }
  else {
    uVar7 = local_258;
    if (((ushort)local_268._9_2_ & 0x70) == 0x10) {
      local_270 = (float_specs)((ulong)fVar4 & 0xffff00ffffffffff);
    }
  }
  if ((float)uVar7 == INFINITY) {
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._1_7_ = 0;
    out_00.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container._0_1_ =
         NAN((float)uVar7);
    specs_00._8_8_ = &local_270;
    specs_00._0_8_ = local_268._8_8_;
    bVar5.container =
         (buffer<char> *)
         write_nonfinite<char,fmt::v10::appender>
                   (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,out_00
                    ,local_268.width._0_1_,specs_00,in_R9);
  }
  else {
    local_258 = uVar7;
    if (((local_268._9_2_ & 0xf) == 4) && (((ulong)local_270 & 0xff0000000000) != 0)) {
      cVar2 = ""[(uint)local_270._4_4_ >> 8 & 0xff];
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                    + 0x18) <
          *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      }
      lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) = lVar1 + 1;
      *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                                container + 8) + lVar1) = cVar2;
      local_270._5_1_ = 0;
      if (local_268.width != 0) {
        local_268.width = local_268.width + -1;
      }
    }
    local_238.size_ = 0;
    local_238._vptr_buffer = (_func_int **)&PTR_grow_0027cc18;
    local_238.capacity_ = 500;
    cVar2 = local_270._4_1_;
    local_238.ptr_ = local_218;
    if (cVar2 == '\x03') {
      bVar6 = ((ulong)local_270 & 0xff0000000000) != 0;
      if (bVar6) {
        local_218[0] = ""[(uint)local_270._4_4_ >> 8 & 0xff];
      }
      local_238.size_ = (size_t)bVar6;
      local_238.capacity_ = 500;
      local_238._vptr_buffer = (_func_int **)&PTR_grow_0027cc18;
      format_hexfloat<double,_0>((double)(float)local_258,local_268.precision,local_270,&local_238);
      local_248.significand = local_238.ptr_;
      local_248.significand_size = (undefined4)local_238.size_;
      local_248.exponent = local_238.size_._4_4_;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_bytes<(fmt::v10::align::type)2,char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_&>
                     (out,&local_268,local_238.size_,local_238.size_,
                      (anon_class_16_1_a7b7af8b *)&local_248);
    }
    else {
      precision = 6;
      if (local_268.type == none) {
        precision = local_268.precision;
      }
      if (-1 < (long)local_268._0_8_) {
        precision = local_268.precision;
      }
      if (cVar2 == '\x01') {
        if (precision == 0x7fffffff) {
          throw_format_error("number is too big");
        }
        precision = precision + 1;
      }
      else {
        iVar3 = 1;
        if (precision != 0) {
          iVar3 = precision;
        }
        if (cVar2 != '\x02') {
          precision = iVar3;
        }
      }
      local_270 = (float_specs)((ulong)local_270 | 0x4000000000000);
      iVar3 = format_float<double>((double)(float)local_258,precision,local_270,&local_238);
      local_270.precision = precision;
      local_248.significand = local_238.ptr_;
      local_248._8_8_ = CONCAT44(iVar3,(int)local_238.size_);
      bVar5.container =
           (buffer<char> *)
           do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                     (out,&local_248,&local_268,local_270,loc);
    }
    if (local_238.ptr_ != local_218) {
      operator_delete(local_238.ptr_);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_float(OutputIt out, T value,
                                 format_specs<Char> specs, locale_ref loc)
    -> OutputIt {
  float_specs fspecs = parse_float_type_spec(specs);
  fspecs.sign = specs.sign;
  if (detail::signbit(value)) {  // value < 0 is false for NaN so use signbit.
    fspecs.sign = sign::minus;
    value = -value;
  } else if (fspecs.sign == sign::minus) {
    fspecs.sign = sign::none;
  }

  if (!detail::isfinite(value))
    return write_nonfinite(out, detail::isnan(value), specs, fspecs);

  if (specs.align == align::numeric && fspecs.sign) {
    auto it = reserve(out, 1);
    *it++ = detail::sign<Char>(fspecs.sign);
    out = base_iterator(out, it);
    fspecs.sign = sign::none;
    if (specs.width != 0) --specs.width;
  }

  memory_buffer buffer;
  if (fspecs.format == float_format::hex) {
    if (fspecs.sign) buffer.push_back(detail::sign<char>(fspecs.sign));
    format_hexfloat(convert_float(value), specs.precision, fspecs, buffer);
    return write_bytes<align::right>(out, {buffer.data(), buffer.size()},
                                     specs);
  }
  int precision = specs.precision >= 0 || specs.type == presentation_type::none
                      ? specs.precision
                      : 6;
  if (fspecs.format == float_format::exp) {
    if (precision == max_value<int>())
      throw_format_error("number is too big");
    else
      ++precision;
  } else if (fspecs.format != float_format::fixed && precision == 0) {
    precision = 1;
  }
  if (const_check(std::is_same<T, float>())) fspecs.binary32 = true;
  int exp = format_float(convert_float(value), precision, fspecs, buffer);
  fspecs.precision = precision;
  auto f = big_decimal_fp{buffer.data(), static_cast<int>(buffer.size()), exp};
  return write_float(out, f, specs, fspecs, loc);
}